

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadGlobalHeader
          (BinaryReader *this,Type *out_type,bool *out_mutable)

{
  Type TVar1;
  Result RVar2;
  undefined8 in_RAX;
  Enum EVar3;
  undefined8 local_38;
  Type global_type;
  uint8_t mutable_;
  
  local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),0xffffffc0);
  local_38 = local_38 & 0xffffffffffffff;
  RVar2 = ReadType(this,(Type *)&local_38,"global type");
  EVar3 = Error;
  if (RVar2.enum_ != Error) {
    TVar1 = (Type)local_38;
    if (((uint)((Type)local_38 + ~V128) < 4) ||
       (((Type)local_38 == V128 && ((this->options_->features).simd_enabled_ != false)))) {
      RVar2 = ReadU8(this,(uint8_t *)((long)&local_38 + 7),"global mutability");
      if (RVar2.enum_ != Error) {
        if (local_38._7_1_ < true) {
          *out_type = TVar1;
          *out_mutable = local_38._7_1_;
          EVar3 = Ok;
        }
        else {
          PrintError(this,"global mutability must be 0 or 1");
        }
      }
    }
    else {
      PrintError(this,"invalid global type: %#x",local_38 & 0xffffffff);
    }
  }
  return (Result)EVar3;
}

Assistant:

Result BinaryReader::ReadGlobalHeader(Type* out_type, bool* out_mutable) {
  Type global_type = Type::Void;
  uint8_t mutable_ = 0;
  CHECK_RESULT(ReadType(&global_type, "global type"));
  ERROR_UNLESS(IsConcreteType(global_type), "invalid global type: %#x",
               static_cast<int>(global_type));

  CHECK_RESULT(ReadU8(&mutable_, "global mutability"));
  ERROR_UNLESS(mutable_ <= 1, "global mutability must be 0 or 1");

  *out_type = global_type;
  *out_mutable = mutable_;
  return Result::Ok;
}